

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O3

int dwarf_line_srcfileno(Dwarf_Line line,Dwarf_Unsigned *ret_fileno,Dwarf_Error *error)

{
  if (line == (Dwarf_Line)0x0 || ret_fileno == (Dwarf_Unsigned *)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x3b);
    return 1;
  }
  *ret_fileno = (line->li_l_data).li_file;
  return 0;
}

Assistant:

int
dwarf_line_srcfileno(Dwarf_Line line,
    Dwarf_Unsigned * ret_fileno, Dwarf_Error * error)
{
    if (line == NULL || ret_fileno == 0) {
        _dwarf_error(NULL, error, DW_DLE_DWARF_LINE_NULL);
        return DW_DLV_ERROR;
    }
    /*  li_file must be <= line->li_context->lc_file_entry_count else
        it is trash. li_file 0 means not attributable to
        any source file per dwarf2/3 spec.
        For DWARF5, li_file < lc_file_entry_count */
    *ret_fileno = (line->li_l_data.li_file);
    return DW_DLV_OK;
}